

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_ignoreOtherParametersMultipleCalls_Test::testBody
          (TEST_MockParameterTest_ignoreOtherParametersMultipleCalls_Test *this)

{
  int iVar1;
  uint uVar2;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  MockActualCall *pMVar4;
  UtestShell *pUVar5;
  TestTerminator *pTVar6;
  undefined4 extraout_var_02;
  SimpleString local_120;
  SimpleString local_110;
  SimpleString local_100;
  SimpleString local_f0;
  SimpleString local_e0;
  SimpleString local_d0;
  SimpleString local_c0;
  SimpleString local_b0;
  SimpleString local_a0;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40 [2];
  SimpleString local_20;
  TEST_MockParameterTest_ignoreOtherParametersMultipleCalls_Test *local_10;
  TEST_MockParameterTest_ignoreOtherParametersMultipleCalls_Test *this_local;
  
  local_10 = this;
  SimpleString::SimpleString(&local_20,"");
  pMVar3 = mock(&local_20,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_40,"foo");
  iVar1 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,local_40);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x48))();
  SimpleString::~SimpleString(local_40);
  SimpleString::~SimpleString(&local_20);
  SimpleString::SimpleString(&local_50,"");
  pMVar3 = mock(&local_50,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_60,"foo");
  iVar1 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_60);
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x48))();
  SimpleString::~SimpleString(&local_60);
  SimpleString::~SimpleString(&local_50);
  SimpleString::SimpleString(&local_70,"");
  pMVar3 = mock(&local_70,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_80,"foo");
  iVar1 = (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_80);
  SimpleString::SimpleString(&local_90,"p2");
  pMVar4 = MockActualCall::withParameter
                     ((MockActualCall *)CONCAT44(extraout_var_01,iVar1),&local_90,2);
  SimpleString::SimpleString(&local_a0,"p3");
  pMVar4 = MockActualCall::withParameter(pMVar4,&local_a0,3);
  SimpleString::SimpleString(&local_b0,"p4");
  MockActualCall::withParameter(pMVar4,&local_b0,4);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString(&local_70);
  pUVar5 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_c0,"");
  pMVar3 = mock(&local_c0,(MockFailureReporter *)0x0);
  uVar2 = (*pMVar3->_vptr_MockSupport[0x26])();
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0xe])
            (pUVar5,1,(ulong)(uVar2 & 1),"LONGS_EQUAL(1, mock().expectedCallsLeft()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
             ,0x247,pTVar6);
  SimpleString::~SimpleString(&local_c0);
  SimpleString::SimpleString(&local_d0,"");
  pMVar3 = mock(&local_d0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_e0,"foo");
  iVar1 = (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_e0);
  SimpleString::SimpleString(&local_f0,"p2");
  pMVar4 = MockActualCall::withParameter
                     ((MockActualCall *)CONCAT44(extraout_var_02,iVar1),&local_f0,2);
  SimpleString::SimpleString(&local_100,"p3");
  pMVar4 = MockActualCall::withParameter(pMVar4,&local_100,3);
  SimpleString::SimpleString(&local_110,"p4");
  MockActualCall::withParameter(pMVar4,&local_110,4);
  SimpleString::~SimpleString(&local_110);
  SimpleString::~SimpleString(&local_100);
  SimpleString::~SimpleString(&local_f0);
  SimpleString::~SimpleString(&local_e0);
  SimpleString::~SimpleString(&local_d0);
  SimpleString::SimpleString(&local_120,"");
  pMVar3 = mock(&local_120,(MockFailureReporter *)0x0);
  (*pMVar3->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_120);
  return;
}

Assistant:

TEST(MockParameterTest, ignoreOtherParametersMultipleCalls)
{
    mock().expectOneCall("foo").ignoreOtherParameters();
    mock().expectOneCall("foo").ignoreOtherParameters();
    mock().actualCall("foo").withParameter("p2", 2).withParameter("p3", 3).withParameter("p4", 4);
    LONGS_EQUAL(1, mock().expectedCallsLeft());
    mock().actualCall("foo").withParameter("p2", 2).withParameter("p3", 3).withParameter("p4", 4);

    mock().checkExpectations();
}